

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianProbitRegressor.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::BayesianProbitRegressor::SerializeWithCachedSizes
          (BayesianProbitRegressor *this,CodedOutputStream *output)

{
  int iVar1;
  string *psVar2;
  size_type sVar3;
  Type *value;
  int index;
  
  if (this->numberoffeatures_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->numberoffeatures_,output);
  }
  if (this->bias_ != (BayesianProbitRegressor_Gaussian *)0x0 &&
      this != (BayesianProbitRegressor *)&_BayesianProbitRegressor_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (2,&this->bias_->super_MessageLite,output);
  }
  iVar1 = (this->features_).super_RepeatedPtrFieldBase.current_size_;
  for (index = 0; iVar1 != index; index = index + 1) {
    value = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<CoreML::Specification::BayesianProbitRegressor_FeatureWeight>::TypeHandler>
                      (&(this->features_).super_RepeatedPtrFieldBase,index);
    google::protobuf::internal::WireFormatLite::WriteMessage(3,&value->super_MessageLite,output);
  }
  psVar2 = (this->regressioninputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (10,(this->regressioninputfeaturename_).ptr_,output);
  }
  psVar2 = (this->optimisminputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xb,(this->optimisminputfeaturename_).ptr_,output);
  }
  psVar2 = (this->samplingscaleinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xc,(this->samplingscaleinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->samplingtruncationinputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0xd,(this->samplingtruncationinputfeaturename_).ptr_,output);
  }
  psVar2 = (this->meanoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x14,(this->meanoutputfeaturename_).ptr_,output);
  }
  psVar2 = (this->varianceoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x15,(this->varianceoutputfeaturename_).ptr_,output);
  }
  psVar2 = (this->pessimisticprobabilityoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName"
              );
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x16,(this->pessimisticprobabilityoutputfeaturename_).ptr_,output);
  }
  psVar2 = (this->sampledprobabilityoutputfeaturename_).ptr_;
  sVar3 = psVar2->_M_string_length;
  if (sVar3 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar2->_M_dataplus)._M_p,(int)sVar3,SERIALIZE,
               "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (0x17,(this->sampledprobabilityoutputfeaturename_).ptr_,output);
    return;
  }
  return;
}

Assistant:

void BayesianProbitRegressor::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.BayesianProbitRegressor)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 numberOfFeatures = 1;
  if (this->numberoffeatures() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->numberoffeatures(), output);
  }

  // .CoreML.Specification.BayesianProbitRegressor.Gaussian bias = 2;
  if (this->has_bias()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, *this->bias_, output);
  }

  // repeated .CoreML.Specification.BayesianProbitRegressor.FeatureWeight features = 3;
  for (unsigned int i = 0, n = this->features_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      3, this->features(i), output);
  }

  // string regressionInputFeatureName = 10;
  if (this->regressioninputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->regressioninputfeaturename().data(), this->regressioninputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.regressionInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->regressioninputfeaturename(), output);
  }

  // string optimismInputFeatureName = 11;
  if (this->optimisminputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->optimisminputfeaturename().data(), this->optimisminputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.optimismInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      11, this->optimisminputfeaturename(), output);
  }

  // string samplingScaleInputFeatureName = 12;
  if (this->samplingscaleinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->samplingscaleinputfeaturename().data(), this->samplingscaleinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingScaleInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      12, this->samplingscaleinputfeaturename(), output);
  }

  // string samplingTruncationInputFeatureName = 13;
  if (this->samplingtruncationinputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->samplingtruncationinputfeaturename().data(), this->samplingtruncationinputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.samplingTruncationInputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      13, this->samplingtruncationinputfeaturename(), output);
  }

  // string meanOutputFeatureName = 20;
  if (this->meanoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->meanoutputfeaturename().data(), this->meanoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.meanOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      20, this->meanoutputfeaturename(), output);
  }

  // string varianceOutputFeatureName = 21;
  if (this->varianceoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->varianceoutputfeaturename().data(), this->varianceoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.varianceOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      21, this->varianceoutputfeaturename(), output);
  }

  // string pessimisticProbabilityOutputFeatureName = 22;
  if (this->pessimisticprobabilityoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->pessimisticprobabilityoutputfeaturename().data(), this->pessimisticprobabilityoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.pessimisticProbabilityOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      22, this->pessimisticprobabilityoutputfeaturename(), output);
  }

  // string sampledProbabilityOutputFeatureName = 23;
  if (this->sampledprobabilityoutputfeaturename().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->sampledprobabilityoutputfeaturename().data(), this->sampledprobabilityoutputfeaturename().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.BayesianProbitRegressor.sampledProbabilityOutputFeatureName");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      23, this->sampledprobabilityoutputfeaturename(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.BayesianProbitRegressor)
}